

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O0

Vec_Int_t *
Acb_NtkCollectCopies(Acb_Ntk_t *p,Gia_Man_t *pGia,Vec_Ptr_t **pvNodesR,Vec_Bit_t **pvPolar)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Vec_Ptr_t *p_02;
  Vec_Bit_t *p_03;
  Vec_Bit_t *p_04;
  Gia_Obj_t *pGVar4;
  void *pvVar5;
  char *pcVar6;
  bool bVar7;
  Vec_Bit_t *vPolar;
  Vec_Bit_t *vDriver;
  Vec_Ptr_t *vNodesR;
  Vec_Int_t *vNodes;
  Vec_Int_t *vObjs;
  int nTargets;
  int iLit;
  int iObj;
  int i;
  Vec_Bit_t **pvPolar_local;
  Vec_Ptr_t **pvNodesR_local;
  Gia_Man_t *pGia_local;
  Acb_Ntk_t *p_local;
  
  iVar1 = Vec_IntSize(&p->vTargets);
  p_00 = Acb_NtkFindNodes2(p);
  iVar2 = Acb_NtkObjNum(p);
  p_01 = Vec_IntAlloc(iVar2);
  iVar2 = Gia_ManObjNum(pGia);
  p_02 = Vec_PtrStart(iVar2);
  iVar2 = Gia_ManObjNum(pGia);
  p_03 = Vec_BitStart(iVar2);
  iVar2 = Gia_ManObjNum(pGia);
  p_04 = Vec_BitStart(iVar2);
  iLit = 0;
  while( true ) {
    iVar2 = Vec_IntSize(pGia->vCis);
    bVar7 = false;
    if (iLit < iVar2) {
      pGVar4 = Gia_ManCi(pGia,iLit);
      nTargets = Gia_ObjId(pGia,pGVar4);
      bVar7 = nTargets != 0;
    }
    if (!bVar7) break;
    iVar2 = Gia_ManCiNum(pGia);
    if (iLit < iVar2 - iVar1) {
      iVar2 = Acb_NtkCi(p,iLit);
      pcVar6 = Acb_ObjNameStr(p,iVar2);
      pcVar6 = Abc_UtilStrsav(pcVar6);
      Vec_PtrWriteEntry(p_02,nTargets,pcVar6);
    }
    else {
      iVar2 = Gia_ManCiNum(pGia);
      iVar2 = Vec_IntEntry(&p->vTargets,iLit - (iVar2 - iVar1));
      pcVar6 = Acb_ObjNameStr(p,iVar2);
      pcVar6 = Abc_UtilStrsav(pcVar6);
      Vec_PtrWriteEntry(p_02,nTargets,pcVar6);
    }
    iLit = iLit + 1;
  }
  iLit = 0;
  while( true ) {
    iVar1 = Vec_IntSize(pGia->vCos);
    bVar7 = false;
    if (iLit < iVar1) {
      pGVar4 = Gia_ManCo(pGia,iLit);
      nTargets = Gia_ObjId(pGia,pGVar4);
      bVar7 = nTargets != 0;
    }
    if (!bVar7) break;
    pGVar4 = Gia_ManObj(pGia,nTargets);
    iVar1 = Gia_ObjFaninId0(pGVar4,nTargets);
    Vec_BitWriteEntry(p_03,iVar1,1);
    iVar1 = Acb_NtkCo(p,iLit);
    pcVar6 = Acb_ObjNameStr(p,iVar1);
    pcVar6 = Abc_UtilStrsav(pcVar6);
    Vec_PtrWriteEntry(p_02,nTargets,pcVar6);
    Vec_IntPush(p_01,nTargets);
    iLit = iLit + 1;
  }
  for (iLit = 0; iVar1 = Vec_IntSize(p_00), iLit < iVar1; iLit = iLit + 1) {
    iVar1 = Vec_IntEntry(p_00,iLit);
    iVar2 = Acb_ObjCopy(p,iVar1);
    if (-1 < iVar2) {
      iVar3 = Abc_Lit2Var(iVar2);
      pGVar4 = Gia_ManObj(pGia,iVar3);
      iVar3 = Gia_ObjIsAnd(pGVar4);
      if (iVar3 != 0) {
        iVar3 = Abc_Lit2Var(iVar2);
        iVar3 = Vec_BitEntry(p_03,iVar3);
        if (iVar3 == 0) {
          iVar3 = Abc_Lit2Var(iVar2);
          pvVar5 = Vec_PtrEntry(p_02,iVar3);
          if (pvVar5 == (void *)0x0) {
            iVar3 = Abc_Lit2Var(iVar2);
            pcVar6 = Acb_ObjNameStr(p,iVar1);
            pcVar6 = Abc_UtilStrsav(pcVar6);
            Vec_PtrWriteEntry(p_02,iVar3,pcVar6);
            iVar1 = Abc_Lit2Var(iVar2);
            Vec_IntPush(p_01,iVar1);
            iVar1 = Abc_Lit2Var(iVar2);
            iVar2 = Abc_LitIsCompl(iVar2);
            Vec_BitWriteEntry(p_04,iVar1,iVar2);
          }
        }
      }
    }
  }
  Vec_BitFree(p_03);
  Vec_IntFree(p_00);
  Vec_IntSort(p_01,0);
  *pvNodesR = p_02;
  *pvPolar = p_04;
  return p_01;
}

Assistant:

Vec_Int_t * Acb_NtkCollectCopies( Acb_Ntk_t * p, Gia_Man_t * pGia, Vec_Ptr_t ** pvNodesR, Vec_Bit_t ** pvPolar )
{
    int i, iObj, iLit, nTargets = Vec_IntSize(&p->vTargets);
    Vec_Int_t * vObjs   = Acb_NtkFindNodes2( p );
    Vec_Int_t * vNodes  = Vec_IntAlloc( Acb_NtkObjNum(p) );
    Vec_Ptr_t * vNodesR = Vec_PtrStart( Gia_ManObjNum(pGia) );
    Vec_Bit_t * vDriver = Vec_BitStart( Gia_ManObjNum(pGia) );
    Vec_Bit_t * vPolar  = Vec_BitStart( Gia_ManObjNum(pGia) );
    Gia_ManForEachCiId( pGia, iObj, i )
        if ( i < Gia_ManCiNum(pGia) - nTargets )
            Vec_PtrWriteEntry( vNodesR, iObj, Abc_UtilStrsav(Acb_ObjNameStr(p, Acb_NtkCi(p, i))) );
        else
            Vec_PtrWriteEntry( vNodesR, iObj, Abc_UtilStrsav(Acb_ObjNameStr(p, Vec_IntEntry(&p->vTargets, i-(Gia_ManCiNum(pGia) - nTargets)))) );
    Gia_ManForEachCoId( pGia, iObj, i )
    {
        Vec_BitWriteEntry( vDriver, Gia_ObjFaninId0(Gia_ManObj(pGia, iObj), iObj), 1 );
        Vec_PtrWriteEntry( vNodesR, iObj, Abc_UtilStrsav(Acb_ObjNameStr(p, Acb_NtkCo(p, i))) );
        Vec_IntPush( vNodes, iObj );
    }
    Vec_IntForEachEntry( vObjs, iObj, i )
        if ( (iLit = Acb_ObjCopy(p, iObj)) >= 0 && Gia_ObjIsAnd(Gia_ManObj(pGia, Abc_Lit2Var(iLit))) )
        {
            if ( !Vec_BitEntry(vDriver, Abc_Lit2Var(iLit)) && Vec_PtrEntry(vNodesR, Abc_Lit2Var(iLit)) == NULL )
            {
                Vec_PtrWriteEntry( vNodesR, Abc_Lit2Var(iLit), Abc_UtilStrsav(Acb_ObjNameStr(p, iObj)) );
                Vec_IntPush( vNodes, Abc_Lit2Var(iLit) );
                Vec_BitWriteEntry( vPolar, Abc_Lit2Var(iLit), Abc_LitIsCompl(iLit) );
            }
        }
    Vec_BitFree( vDriver );
    Vec_IntFree( vObjs );
    Vec_IntSort( vNodes, 0 );
    *pvNodesR = vNodesR;
    *pvPolar  = vPolar;
    return vNodes;
}